

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

SectionTracker *
Catch::TestCaseTracking::SectionTracker::acquire
          (TrackerContext *ctx,NameAndLocation *nameAndLocation)

{
  ITracker *pIVar1;
  undefined8 uVar2;
  char cVar3;
  shared_ptr<Catch::TestCaseTracking::SectionTracker> section;
  ITrackerPtr childTracker;
  undefined1 auStack_58 [32];
  long *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  ITracker *local_28;
  
  auStack_58._16_8_ = (SectionTracker *)0x0;
  auStack_58._24_8_ = 0;
  pIVar1 = ctx->m_currentTracker;
  (*pIVar1->_vptr_ITracker[0xc])(&local_38,pIVar1,nameAndLocation);
  if (local_38 == (long *)0x0) {
    local_28 = pIVar1;
    std::
    make_shared<Catch::TestCaseTracking::SectionTracker,Catch::TestCaseTracking::NameAndLocation_const&,Catch::TestCaseTracking::TrackerContext&,Catch::TestCaseTracking::ITracker*>
              ((NameAndLocation *)auStack_58,(TrackerContext *)nameAndLocation,(ITracker **)ctx);
    clara::std::__shared_ptr<Catch::TestCaseTracking::SectionTracker,_(__gnu_cxx::_Lock_policy)2>::
    operator=((__shared_ptr<Catch::TestCaseTracking::SectionTracker,_(__gnu_cxx::_Lock_policy)2> *)
              (auStack_58 + 0x10),
              (__shared_ptr<Catch::TestCaseTracking::SectionTracker,_(__gnu_cxx::_Lock_policy)2> *)
              auStack_58);
    clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 8));
    std::__shared_ptr<Catch::TestCaseTracking::ITracker,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Catch::TestCaseTracking::SectionTracker,void>
              ((__shared_ptr<Catch::TestCaseTracking::ITracker,(__gnu_cxx::_Lock_policy)2> *)
               auStack_58,
               (__shared_ptr<Catch::TestCaseTracking::SectionTracker,_(__gnu_cxx::_Lock_policy)2> *)
               (auStack_58 + 0x10));
    (*pIVar1->_vptr_ITracker[0xb])(pIVar1,auStack_58);
  }
  else {
    cVar3 = (**(code **)(*local_38 + 0x70))();
    if (cVar3 == '\0') {
      __assert_fail("childTracker->isSectionTracker()",
                    "/workspace/llm4binary/github/license_c_cmakelists/bnoazx005[P]tcpp/tests/ThirdParty/Catch2/single_include/catch2/catch.hpp"
                    ,0x38cb,
                    "static SectionTracker &Catch::TestCaseTracking::SectionTracker::acquire(TrackerContext &, const NameAndLocation &)"
                   );
    }
    std::
    static_pointer_cast<Catch::TestCaseTracking::SectionTracker,Catch::TestCaseTracking::ITracker>
              ((shared_ptr<Catch::TestCaseTracking::ITracker> *)auStack_58);
    clara::std::__shared_ptr<Catch::TestCaseTracking::SectionTracker,_(__gnu_cxx::_Lock_policy)2>::
    operator=((__shared_ptr<Catch::TestCaseTracking::SectionTracker,_(__gnu_cxx::_Lock_policy)2> *)
              (auStack_58 + 0x10),
              (__shared_ptr<Catch::TestCaseTracking::SectionTracker,_(__gnu_cxx::_Lock_policy)2> *)
              auStack_58);
  }
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 8));
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  if (ctx->m_runState != CompletedCycle) {
    tryOpen((SectionTracker *)auStack_58._16_8_);
  }
  uVar2 = auStack_58._16_8_;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 0x18));
  return (SectionTracker *)uVar2;
}

Assistant:

SectionTracker& SectionTracker::acquire( TrackerContext& ctx, NameAndLocation const& nameAndLocation ) {
        std::shared_ptr<SectionTracker> section;

        ITracker& currentTracker = ctx.currentTracker();
        if( ITrackerPtr childTracker = currentTracker.findChild( nameAndLocation ) ) {
            assert( childTracker );
            assert( childTracker->isSectionTracker() );
            section = std::static_pointer_cast<SectionTracker>( childTracker );
        }
        else {
            section = std::make_shared<SectionTracker>( nameAndLocation, ctx, &currentTracker );
            currentTracker.addChild( section );
        }
        if( !ctx.completedCycle() )
            section->tryOpen();
        return *section;
    }